

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neverbleed.c
# Opt level: O0

int setuidgid_stub(expbuf_t *buf)

{
  int iVar1;
  char *pcVar2;
  int *piVar3;
  char *dir;
  char acStack_10068 [4];
  int ret;
  char pwstrbuf [65536];
  passwd *local_60;
  passwd *pw;
  passwd pwbuf;
  size_t change_socket_ownership;
  char *user;
  expbuf_t *buf_local;
  
  dir._4_4_ = -1;
  pcVar2 = expbuf_shift_str(buf);
  if ((pcVar2 == (char *)0x0) ||
     (iVar1 = expbuf_shift_num(buf,(size_t *)&pwbuf.pw_shell), iVar1 != 0)) {
    piVar3 = __errno_location();
    *piVar3 = 0;
    warnf("%s: failed to parse request","setuidgid_stub");
    return -1;
  }
  piVar3 = __errno_location();
  *piVar3 = 0;
  iVar1 = getpwnam_r(pcVar2,(passwd *)&pw,acStack_10068,0x10000,&local_60);
  if (iVar1 == 0) {
    if (local_60 == (passwd *)0x0) {
      warnf("%s: failed to obtain information of user:%s","setuidgid_stub",pcVar2);
    }
    else {
      if (pwbuf.pw_shell != (char *)0x0) {
        iVar1 = chown(((daemon_vars.nb)->sun_).sun_path,local_60->pw_uid,local_60->pw_gid);
        if (iVar1 != 0) {
          dief("chown failed for:%s",((daemon_vars.nb)->sun_).sun_path);
        }
        pcVar2 = dirname(((daemon_vars.nb)->sun_).sun_path);
        iVar1 = chown(pcVar2,local_60->pw_uid,local_60->pw_gid);
        if (iVar1 != 0) {
          dief("chown failed for:%s",pcVar2);
        }
        free(pcVar2);
      }
      iVar1 = setgid(local_60->pw_gid);
      if (iVar1 == 0) {
        iVar1 = initgroups(local_60->pw_name,local_60->pw_gid);
        if (iVar1 == 0) {
          iVar1 = setuid(local_60->pw_uid);
          if (iVar1 == 0) {
            dir._4_4_ = 0;
          }
          else {
            warnf("%s: setuid(%d) failed\n","setuidgid_stub",(ulong)local_60->pw_uid);
          }
        }
        else {
          warnf("%s: initgroups(%s, %d) failed","setuidgid_stub",local_60->pw_name,
                (ulong)local_60->pw_gid);
        }
      }
      else {
        warnf("%s: setgid(%d) failed","setuidgid_stub",(ulong)local_60->pw_gid);
      }
    }
  }
  else {
    warnf("%s: getpwnam_r failed","setuidgid_stub");
  }
  expbuf_dispose(buf);
  expbuf_push_num(buf,(long)dir._4_4_);
  return 0;
}

Assistant:

static int setuidgid_stub(struct expbuf_t *buf)
{
    const char *user;
    size_t change_socket_ownership;
    struct passwd pwbuf, *pw;
    char pwstrbuf[65536]; /* should be large enough */
    int ret = -1;

    if ((user = expbuf_shift_str(buf)) == NULL || expbuf_shift_num(buf, &change_socket_ownership) != 0) {
        errno = 0;
        warnf("%s: failed to parse request", __FUNCTION__);
        return -1;
    }

    errno = 0;
    if (getpwnam_r(user, &pwbuf, pwstrbuf, sizeof(pwstrbuf), &pw) != 0) {
        warnf("%s: getpwnam_r failed", __FUNCTION__);
        goto Respond;
    }
    if (pw == NULL) {
        warnf("%s: failed to obtain information of user:%s", __FUNCTION__, user);
        goto Respond;
    }

    if (change_socket_ownership) {
        char *dir;
        if (chown(daemon_vars.nb->sun_.sun_path, pw->pw_uid, pw->pw_gid) != 0)
            dief("chown failed for:%s", daemon_vars.nb->sun_.sun_path);
        dir = dirname(daemon_vars.nb->sun_.sun_path);
        if (chown(dir, pw->pw_uid, pw->pw_gid) != 0)
            dief("chown failed for:%s", dir);
        free(dir);
    }

    /* setuidgid */
    if (setgid(pw->pw_gid) != 0) {
        warnf("%s: setgid(%d) failed", __FUNCTION__, (int)pw->pw_gid);
        goto Respond;
    }
    if (initgroups(pw->pw_name, pw->pw_gid) != 0) {
        warnf("%s: initgroups(%s, %d) failed", __FUNCTION__, pw->pw_name, (int)pw->pw_gid);
        goto Respond;
    }
    if (setuid(pw->pw_uid) != 0) {
        warnf("%s: setuid(%d) failed\n", __FUNCTION__, (int)pw->pw_uid);
        goto Respond;
    }
    ret = 0;

Respond:
    expbuf_dispose(buf);
    expbuf_push_num(buf, ret);
    return 0;
}